

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O3

uint32_t __thiscall
ixy::IxgbeDevice::tx_batch
          (IxgbeDevice *this,uint16_t queue_id,
          deque<ixy::Packet,_std::allocator<ixy::Packet>_> *buffer)

{
  ixgbe_tx_queue *queue;
  uint16_t uVar1;
  undefined2 uVar2;
  pointer piVar3;
  ixgbe_adv_tx_desc *piVar4;
  _Elt_pointer puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  value_type *p;
  _Elt_pointer pPVar9;
  uint32_t uVar10;
  undefined6 in_register_00000032;
  ulong uVar11;
  
  uVar11 = CONCAT62(in_register_00000032,queue_id) & 0xffffffff;
  piVar3 = (this->tx_queues).
           super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->tx_queues).
                 super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 4) * 0x6db6db6db6db6db7
  ;
  if (uVar8 < uVar11 || uVar8 - uVar11 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  else {
    queue = piVar3 + uVar11;
    clean_tx_queue(queue);
    uVar1 = piVar3[uVar11].clean_index;
    uVar6 = (uint)piVar3[uVar11].tx_index;
    if ((piVar3[uVar11].mempool.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         == (element_type *)0x0) &&
       (pPVar9 = (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur,
       (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur != pPVar9)) {
      (queue->mempool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pPVar9->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(queue->mempool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(pPVar9->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    pPVar9 = (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if ((buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_cur == pPVar9) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      do {
        uVar6 = *(int *)&queue->num_entries - 1U & uVar6 + 1;
        if (uVar1 == (uint16_t)uVar6) break;
        piVar4 = queue->descriptors;
        lVar7 = (ulong)queue->tx_index * 0x10;
        piVar4[queue->tx_index].read.buffer_addr = pPVar9->addr_phys;
        *(uint *)((long)piVar4 + lVar7 + 8) = (uint)pPVar9->len | 0x2b300000;
        *(int *)((long)piVar4 + lVar7 + 0xc) = (int)pPVar9->len << 0xe;
        puVar5 = (queue->bufs_in_use).
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (puVar5 == (queue->bufs_in_use).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_long,std::allocator<unsigned_long>>::
          _M_push_back_aux<unsigned_long_const&>
                    ((deque<unsigned_long,std::allocator<unsigned_long>> *)&queue->bufs_in_use,
                     &pPVar9->pool_entry);
        }
        else {
          *puVar5 = pPVar9->pool_entry;
          (queue->bufs_in_use).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar5 + 1;
        }
        this_00 = (pPVar9->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        (pPVar9->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pPVar9->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        uVar2 = queue->num_entries;
        queue->tx_index = uVar2 - 1 & (short)*(undefined4 *)&queue->tx_index + 1U;
        std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::pop_front(buffer);
        uVar10 = uVar10 + 1;
        pPVar9 = (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
      } while ((buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur != pPVar9);
    }
    uVar8 = (ulong)(uint)((int)CONCAT62(in_register_00000032,queue_id) << 6) + 0x6018;
    if (uVar8 <= this->len - 4) {
      *(uint *)(this->addr + uVar8) = (uint)queue->tx_index;
      return uVar10;
    }
  }
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1d2,"void ixy::IxgbeDevice::set_reg32(uint64_t, uint32_t)");
}

Assistant:

auto IxgbeDevice::tx_batch(uint16_t queue_id, std::deque<Packet> &buffer) -> uint32_t {
    auto sent_packets = 0;

    struct ixgbe_tx_queue *queue = &tx_queues.at(queue_id);

    clean_tx_queue(queue);

    auto cur_index = queue->tx_index;
    auto clean_index = queue->clean_index;

    if (!queue->mempool && !buffer.empty()) {
        queue->mempool = buffer.front().pool;
    }

    while (!buffer.empty()) {
        auto &p = buffer.front();

        auto next_index = wrap_ring(cur_index, queue->num_entries);

        if (clean_index == next_index) {
            // tx queue of device is full
            break;
        }

        volatile union ixgbe_adv_tx_desc *txd = queue->descriptors + queue->tx_index;
        // NIC reads from here
        txd->read.buffer_addr = p.get_phys_addr();
        // always the same flags: one buffer (EOP), advanced data descriptor, CRC offload, data length
        txd->read.cmd_type_len =
                static_cast<u32>(IXGBE_ADVTXD_DCMD_EOP | IXGBE_ADVTXD_DCMD_RS | IXGBE_ADVTXD_DCMD_IFCS |
                                 IXGBE_ADVTXD_DCMD_DEXT |
                                 IXGBE_ADVTXD_DTYP_DATA | p.size());
        // no fancy offloading stuff - only the total payload length
        // implement offloading flags here:
        // 	* ip checksum offloading is trivial: just set the offset
        // 	* tcp/udp checksum offloading is more annoying, you have to precalculate the pseudo-header checksum
        txd->read.olinfo_status = static_cast<u32>(p.size() << IXGBE_ADVTXD_PAYLEN_SHIFT);

        queue->bufs_in_use.push_back(p.pool_entry);

        p.pool.reset();

        queue->tx_index = wrap_ring(queue->tx_index, queue->num_entries);

        buffer.pop_front();

        cur_index = next_index;
        sent_packets += 1;
    }

    set_reg32(IXGBE_TDT(queue_id), queue->tx_index);

    return sent_packets;
}